

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::RepeatedField_ArenaAllocationSizesMatchExpectedValues_Test::
TestBody(RepeatedField_ArenaAllocationSizesMatchExpectedValues_Test *this)

{
  bool bVar1;
  AssertHelper local_c0;
  Message local_b8;
  undefined1 local_b0 [8];
  HasNewFatalFailureHelper gtest_fatal_failure_checker_3;
  Message local_90;
  undefined1 local_88 [8];
  HasNewFatalFailureHelper gtest_fatal_failure_checker_2;
  Message local_68;
  undefined1 local_60 [8];
  HasNewFatalFailureHelper gtest_fatal_failure_checker_1;
  Message local_40;
  int local_38;
  undefined1 local_28 [8];
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  RepeatedField_ArenaAllocationSizesMatchExpectedValues_Test *this_local;
  
  gtest_fatal_failure_checker.original_reporter_ = (TestPartResultReporterInterface *)this;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)local_28);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      protobuf::(anonymous_namespace)::CheckAllocationSizes<google::protobuf::RepeatedField<bool>>()
      ;
    }
    bVar1 = testing::internal::HasNewFatalFailureHelper::has_new_fatal_failure
                      ((HasNewFatalFailureHelper *)local_28);
    if (bVar1) {
      local_38 = 2;
    }
    else {
      local_38 = 0;
    }
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)local_28);
    if (local_38 != 0) goto LAB_00ce0e7c;
  }
  else {
LAB_00ce0e7c:
    testing::Message::Message(&local_40);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_fatal_failure_checker_1.original_reporter_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field_unittest.cc"
               ,0xde,
               "Expected: CheckAllocationSizes<RepeatedField<bool>>() doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
              );
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_fatal_failure_checker_1.original_reporter_,&local_40);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)&gtest_fatal_failure_checker_1.original_reporter_);
    testing::Message::~Message(&local_40);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)local_60);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      protobuf::(anonymous_namespace)::
      CheckAllocationSizes<google::protobuf::RepeatedField<unsigned_int>>();
    }
    bVar1 = testing::internal::HasNewFatalFailureHelper::has_new_fatal_failure
                      ((HasNewFatalFailureHelper *)local_60);
    if (bVar1) {
      local_38 = 3;
    }
    else {
      local_38 = 0;
    }
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)local_60);
    if (local_38 != 0) goto LAB_00ce0f99;
  }
  else {
LAB_00ce0f99:
    testing::Message::Message(&local_68);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_fatal_failure_checker_2.original_reporter_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field_unittest.cc"
               ,0xdf,
               "Expected: CheckAllocationSizes<RepeatedField<uint32_t>>() doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
              );
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_fatal_failure_checker_2.original_reporter_,&local_68);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)&gtest_fatal_failure_checker_2.original_reporter_);
    testing::Message::~Message(&local_68);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)local_88);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      protobuf::(anonymous_namespace)::
      CheckAllocationSizes<google::protobuf::RepeatedField<unsigned_long>>();
    }
    bVar1 = testing::internal::HasNewFatalFailureHelper::has_new_fatal_failure
                      ((HasNewFatalFailureHelper *)local_88);
    if (bVar1) {
      local_38 = 4;
    }
    else {
      local_38 = 0;
    }
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)local_88);
    if (local_38 == 0) goto LAB_00ce114e;
  }
  testing::Message::Message(&local_90);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_fatal_failure_checker_3.original_reporter_,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field_unittest.cc"
             ,0xe0,
             "Expected: CheckAllocationSizes<RepeatedField<uint64_t>>() doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
            );
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)&gtest_fatal_failure_checker_3.original_reporter_,&local_90);
  testing::internal::AssertHelper::~AssertHelper
            ((AssertHelper *)&gtest_fatal_failure_checker_3.original_reporter_);
  testing::Message::~Message(&local_90);
LAB_00ce114e:
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)local_b0);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      protobuf::(anonymous_namespace)::
      CheckAllocationSizes<google::protobuf::RepeatedField<absl::lts_20250127::Cord>>();
    }
    bVar1 = testing::internal::HasNewFatalFailureHelper::has_new_fatal_failure
                      ((HasNewFatalFailureHelper *)local_b0);
    if (bVar1) {
      local_38 = 5;
    }
    else {
      local_38 = 0;
    }
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)local_b0);
    if (local_38 == 0) {
      return;
    }
  }
  testing::Message::Message(&local_b8);
  testing::internal::AssertHelper::AssertHelper
            (&local_c0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field_unittest.cc"
             ,0xe1,
             "Expected: CheckAllocationSizes<RepeatedField<absl::Cord>>() doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
            );
  testing::internal::AssertHelper::operator=(&local_c0,&local_b8);
  testing::internal::AssertHelper::~AssertHelper(&local_c0);
  testing::Message::~Message(&local_b8);
  return;
}

Assistant:

TEST(RepeatedField, ArenaAllocationSizesMatchExpectedValues) {
  // RepeatedField guarantees that in 64-bit mode we never allocate anything
  // smaller than 16 bytes from an arena.
  // This is important to avoid a branch in the reallocation path.
  // This is also important because allocating anything less would be wasting
  // memory.
  // If the allocation size is wrong, ReturnArrayMemory will ABSL_DCHECK.
  EXPECT_NO_FATAL_FAILURE(CheckAllocationSizes<RepeatedField<bool>>());
  EXPECT_NO_FATAL_FAILURE(CheckAllocationSizes<RepeatedField<uint32_t>>());
  EXPECT_NO_FATAL_FAILURE(CheckAllocationSizes<RepeatedField<uint64_t>>());
  EXPECT_NO_FATAL_FAILURE(CheckAllocationSizes<RepeatedField<absl::Cord>>());
}